

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::truncUFloat
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Unary *curr,
          Literal *value)

{
  uintptr_t uVar1;
  char cVar2;
  int32_t iVar3;
  int64_t iVar4;
  double dVar5;
  uintptr_t uStack_40;
  
  dVar5 = (double)::wasm::Literal::getFloat();
  if (NAN(dVar5)) {
    (*this->_vptr_ExpressionRunner[2])(this,"truncUFloat of nan");
  }
  uVar1 = (value->type).id;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id == 2) {
    if (uVar1 == 4) {
      iVar3 = Literal::reinterpreti32(value);
      cVar2 = ::wasm::isInRangeI32TruncU(iVar3);
    }
    else {
      iVar4 = Literal::reinterpreti64(value);
      cVar2 = ::wasm::isInRangeI32TruncU(iVar4);
    }
    if (cVar2 == '\0') {
      (*this->_vptr_ExpressionRunner[2])(this,"i32.truncUFloat overflow");
    }
    (__return_storage_ptr__->field_0).i32 = (int32_t)(long)dVar5;
    uStack_40 = 2;
  }
  else {
    if (uVar1 == 4) {
      iVar3 = Literal::reinterpreti32(value);
      cVar2 = ::wasm::isInRangeI64TruncU(iVar3);
    }
    else {
      iVar4 = Literal::reinterpreti64(value);
      cVar2 = ::wasm::isInRangeI64TruncU(iVar4);
    }
    if (cVar2 == '\0') {
      (*this->_vptr_ExpressionRunner[2])(this,"i64.truncUFloat overflow");
    }
    (__return_storage_ptr__->field_0).func.super_IString.str._M_len =
         (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
    uStack_40 = 3;
  }
  (__return_storage_ptr__->type).id = uStack_40;
  return __return_storage_ptr__;
}

Assistant:

Literal truncUFloat(Unary* curr, Literal value) {
    double val = value.getFloat();
    if (std::isnan(val)) {
      trap("truncUFloat of nan");
    }
    if (curr->type == Type::i32) {
      if (value.type == Type::f32) {
        if (!isInRangeI32TruncU(value.reinterpreti32())) {
          trap("i32.truncUFloat overflow");
        }
      } else {
        if (!isInRangeI32TruncU(value.reinterpreti64())) {
          trap("i32.truncUFloat overflow");
        }
      }
      return Literal(uint32_t(val));
    } else {
      if (value.type == Type::f32) {
        if (!isInRangeI64TruncU(value.reinterpreti32())) {
          trap("i64.truncUFloat overflow");
        }
      } else {
        if (!isInRangeI64TruncU(value.reinterpreti64())) {
          trap("i64.truncUFloat overflow");
        }
      }
      return Literal(uint64_t(val));
    }
  }